

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.c
# Opt level: O1

void conv_directx(double *inp1,int N,double *inp2,int L,double *oup)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = (N + L) - 1;
  if (0 < (int)uVar2) {
    uVar3 = 0;
    do {
      oup[uVar3] = 0.0;
      if (0 < N) {
        uVar1 = 0;
        uVar4 = uVar3;
        do {
          if ((long)uVar4 < (long)L && -1 < (long)uVar4) {
            oup[uVar3] = inp1[uVar1] * inp2[uVar4] + oup[uVar3];
          }
          uVar1 = uVar1 + 1;
          uVar4 = uVar4 - 1;
        } while ((uint)N != uVar1);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar2);
  }
  return;
}

Assistant:

void conv_directx(fft_type *inp1,int N, fft_type *inp2, int L,fft_type *oup){
	int M,k,n;
	
	M = N + L - 1;
	
	for (k = 0; k < M;++k) {
		oup[k] = 0.0;
		for ( n = 0; n < N; ++n) {
			if ( (k-n) >= 0 && (k-n) < L ) {
				oup[k]+= inp1[n] * inp2[k-n];
			}
		}
		
	}
		
}